

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::hash_pnext_chain_pdf2(StateRecorder *recorder,Hasher *h,void *pNext)

{
  VkStructureType VVar1;
  allocator local_51;
  string local_50;
  VkBaseInStructure *local_30;
  VkBaseInStructure *pin;
  void *pNext_local;
  Hasher *h_local;
  StateRecorder *recorder_local;
  
  pin = (VkBaseInStructure *)pNext;
  pNext_local = h;
  h_local = (Hasher *)recorder;
  do {
    local_30 = (VkBaseInStructure *)pnext_chain_pdf2_skip_ignored_entries(pin);
    if (local_30 == (VkBaseInStructure *)0x0) {
      return true;
    }
    pin = local_30;
    Hasher::s32((Hasher *)pNext_local,local_30->sType);
    VVar1 = local_30->sType;
    if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDeviceMeshShaderFeaturesNV *)pin);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDeviceFragmentShadingRateFeaturesKHR *)pin);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDeviceRobustness2FeaturesEXT *)pin);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDeviceDescriptorBufferFeaturesEXT *)pin);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *)pin);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDeviceMeshShaderFeaturesEXT *)pin);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDeviceImageRobustnessFeaturesEXT *)pin);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *)pin);
    }
    else if (VVar1 == VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT) {
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)pin);
    }
    else {
      if (VVar1 != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_50,"Unsupported pNext found, cannot hash.",&local_51);
        log_error_pnext_chain(&local_50,pin);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator((allocator<char> *)&local_51);
        return false;
      }
      hash_pnext_struct((StateRecorder *)h_local,(Hasher *)pNext_local,
                        (VkPhysicalDeviceShaderObjectFeaturesEXT *)pin);
    }
    pin = local_30->pNext;
  } while( true );
}

Assistant:

static bool hash_pnext_chain_pdf2(const StateRecorder *recorder, Hasher &h, const void *pNext)
{
	while ((pNext = pnext_chain_pdf2_skip_ignored_entries(pNext)) != nullptr)
	{
		auto *pin = static_cast<const VkBaseInStructure *>(pNext);
		h.s32(pin->sType);

		// Pull in any robustness-like feature and other types which are known to affect shader compilation.
		switch (pin->sType)
		{
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDeviceRobustness2FeaturesEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDeviceImageRobustnessFeaturesEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_ENUMS_FEATURES_NV:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDeviceFragmentShadingRateEnumsFeaturesNV *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDeviceFragmentShadingRateFeaturesKHR *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDeviceMeshShaderFeaturesEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MESH_SHADER_FEATURES_NV:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDeviceMeshShaderFeaturesNV *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDeviceDescriptorBufferFeaturesEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_OBJECT_FEATURES_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDeviceShaderObjectFeaturesEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PRIMITIVES_GENERATED_QUERY_FEATURES_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *>(pNext));
			break;

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_2D_VIEW_OF_3D_FEATURES_EXT:
			hash_pnext_struct(recorder, h, *static_cast<const VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *>(pNext));
			break;

		default:
			log_error_pnext_chain("Unsupported pNext found, cannot hash.", pNext);
			return false;
		}

		pNext = pin->pNext;
	}

	return true;
}